

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O3

unsigned_long LocaleIndependentAtoi<unsigned_long>(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_long> _Var7;
  unsigned_long result;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  long local_28;
  
  pcVar6 = str._M_str;
  uVar4 = str._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_len = uVar4;
  local_38._M_str = pcVar6;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      pvVar1 = memchr(" \f\n\r\t\v",(int)pcVar6[uVar3],6);
      if (pvVar1 == (void *)0x0) {
        if (uVar3 != 0xffffffffffffffff) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_38," \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_38._M_len < uVar3) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar3);
            }
            goto LAB_0074f700;
          }
          uVar5 = (sVar2 - uVar3) + 1;
          if (local_38._M_len - uVar3 < uVar5) {
            uVar5 = local_38._M_len - uVar3;
          }
          pcVar6 = local_38._M_str + uVar3;
          if (uVar5 == 0) {
            uVar5 = 0;
            goto LAB_0074f67e;
          }
          if (*pcVar6 != '+') goto LAB_0074f67e;
          if ((uVar5 != 1) && (local_38._M_str[uVar3 + 1] == '-')) goto LAB_0074f6a6;
          uVar5 = uVar5 - 1;
          pcVar6 = local_38._M_str + uVar3 + 1;
          goto LAB_0074f67e;
        }
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  uVar5 = 0;
  pcVar6 = (char *)0x0;
LAB_0074f67e:
  _Var7 = std::from_chars<unsigned_long>(pcVar6,pcVar6 + uVar5,&local_38._M_len,10);
  uVar4 = local_38._M_len;
  if (_Var7.ec != 0) {
    if ((_Var7.ec == result_out_of_range) && ((uVar5 == 0 || (*pcVar6 != '-')))) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
LAB_0074f6a6:
      uVar4 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar4;
  }
LAB_0074f700:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}